

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

int Cec_ManPatComputePattern_rec(Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar4 = 0;
  if (p->pTravIds[iVar2] != p->nTravIds) {
    p->pTravIds[iVar2] = p->nTravIds;
    uVar3 = (uint)*(undefined8 *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) {
      uVar3 = Cec_ObjSatVarValue(pSat,pObj);
      uVar5 = *(ulong *)pObj;
      iVar4 = 1;
    }
    else {
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x97,
                      "int Cec_ManPatComputePattern_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = Cec_ManPatComputePattern_rec(pSat,p,pObj + -(ulong)(uVar3 & 0x1fffffff));
      iVar4 = Cec_ManPatComputePattern_rec
                        (pSat,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar4 = iVar4 + iVar2;
      uVar5 = *(ulong *)pObj;
      uVar3 = ((uint)(uVar5 >> 0x3d) ^
              (uint)((ulong)*(undefined8 *)(pObj + -(uVar5 >> 0x20 & 0x1fffffff)) >> 0x3e)) &
              ((uint)((ulong)*(undefined8 *)(pObj + -(uVar5 & 0x1fffffff)) >> 0x3e) ^
              (uint)(uVar5 >> 0x1d) & 7);
    }
    *(ulong *)pObj = uVar5 & 0xbfffffffffffffff | (ulong)(uVar3 & 1) << 0x3e;
  }
  return iVar4;
}

Assistant:

int Cec_ManPatComputePattern_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Counter = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark1 = Cec_ObjSatVarValue( pSat, pObj );
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin0(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin1(pObj) );
    pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                   (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
    return Counter;
}